

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  ID *__k;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  CompilerGLSL *this_00;
  SPIRType *pSVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  _Hash_node_base *p_Var9;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *psVar10;
  undefined7 in_register_00000011;
  string *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  char *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  int iVar17;
  __hashtable *__h_1;
  ulong uVar18;
  uint32_t alignment;
  string buffer_name;
  string decorations;
  Bitset flags;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  __node_gen_type __node_gen;
  uint local_1304;
  CompilerGLSL *local_1300;
  key_type local_12f8;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_12d8;
  ulong local_12d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  string local_12a8;
  Bitset local_1288;
  undefined1 local_1248 [16];
  undefined1 local_1238 [272];
  undefined1 local_1128 [16];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1118 [73];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  uVar18 = (ulong)type_id;
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      uVar18);
  local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
  local_12f8._M_string_length = 0;
  local_12f8.field_2._M_local_buf[0] = '\0';
  iVar17 = (int)CONCAT71(in_register_00000011,forward_declaration);
  local_1300 = (CompilerGLSL *)CONCAT44(local_1300._4_4_,iVar17);
  if (iVar17 == 0) {
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xf) {
      psVar10 = (string *)0x0;
      (*(this->super_Compiler)._vptr_Compiler[6])
                (local_1128,this,(ulong)(pSVar6->super_IVariant).self.id);
    }
    else {
      psVar10 = (string *)0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar6);
    }
    ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  else {
    ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (local_1128,this,(ulong)(pSVar6->super_IVariant).self.id);
    __k = &(pSVar6->super_IVariant).self;
    ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    local_12d8 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    pmVar7 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_12d8,__k);
    if ((((pmVar7->decoration).alias._M_string_length == 0) ||
        (iVar8 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(this->block_ssbo_names)._M_h,&local_12f8),
        iVar8.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0)) ||
       (iVar8 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->resource_names)._M_h,&local_12f8),
       iVar8.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x36aaac,(char (*) [2])__k,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    variables_primary = &this->block_ssbo_names;
    psVar10 = &local_12f8;
    add_variable(this,variables_primary,&this->resource_names,psVar10);
    if (local_12f8._M_string_length == 0) {
      local_12d0 = uVar18;
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x36aaac,(char (*) [2])__k,
                 (TypedID<(spirv_cross::Types)0> *)psVar10);
      ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
      uVar18 = local_12d0;
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
        uVar18 = local_12d0;
      }
    }
    local_1128._0_8_ = &this->block_names;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1128._0_8_,&local_12f8);
    local_1128._0_8_ = variables_primary;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)variables_primary,&local_12f8);
    pmVar7 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_12d8,__k);
    ::std::__cxx11::string::_M_assign((string *)pmVar7);
  }
  if ((char)local_1300 == '\0') {
    uVar4 = (this->super_Compiler).physical_storage_type_to_alignment._M_h._M_bucket_count;
    psVar11 = (string *)(uVar18 % uVar4);
    p_Var13 = (this->super_Compiler).physical_storage_type_to_alignment._M_h._M_buckets
              [(long)psVar11];
    p_Var14 = (__node_base_ptr)0x0;
    if ((p_Var13 != (__node_base_ptr)0x0) &&
       (p_Var9 = p_Var13->_M_nxt, p_Var14 = p_Var13,
       *(uint32_t *)&p_Var13->_M_nxt[1]._M_nxt != type_id)) {
      while (p_Var13 = p_Var9, p_Var9 = p_Var13->_M_nxt, psVar10 = psVar11,
            p_Var9 != (_Hash_node_base *)0x0) {
        p_Var14 = (__node_base_ptr)0x0;
        if (((string *)((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar4) != psVar11) ||
           (p_Var14 = p_Var13, *(uint *)&p_Var9[1]._M_nxt == type_id)) goto LAB_001e3bbe;
      }
      p_Var14 = (__node_base_ptr)0x0;
    }
LAB_001e3bbe:
    if (p_Var14 == (__node_base_ptr)0x0) {
      p_Var9 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var9 = p_Var14->_M_nxt;
    }
    local_1304 = 0;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      local_1304 = *(uint *)((long)&p_Var9[1]._M_nxt + 4);
    }
    local_1300 = this;
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xf) {
      local_1248._0_8_ = local_1238 + 8;
      local_1248._8_8_ = 0;
      local_1238._0_8_ = 8;
      pcVar2 = local_1128 + 0x10;
      local_1128._0_8_ = pcVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"buffer_reference","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((pointer)local_1128._0_8_ != pcVar2) {
        operator_delete((void *)local_1128._0_8_);
      }
      if (local_1304 != 0) {
        join<char_const(&)[26],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)0x35e939,(char (*) [26])&local_1304,
                   (uint *)psVar10);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1248,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((pointer)local_1128._0_8_ != pcVar2) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      buffer_to_packing_standard_abi_cxx11_((string *)local_1128,this,pSVar6,true);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((pointer)local_1128._0_8_ != pcVar2) {
        operator_delete((void *)local_1128._0_8_);
      }
      ParsedIR::get_buffer_block_type_flags(&local_1288,&(this->super_Compiler).ir,pSVar6);
      paVar1 = &local_12c8.field_2;
      local_12c8._M_string_length = 0;
      local_12c8.field_2._M_local_buf[0] = '\0';
      local_12c8._M_dataplus._M_p = (pointer)paVar1;
      if ((local_1288.lower._2_1_ & 8) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      if ((local_1288.lower._2_1_ & 0x80) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      if ((local_1288.lower._3_1_ & 2) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      if ((local_1288.lower._3_1_ & 1) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c8);
      }
      local_110 = local_f8;
      local_1128._0_8_ =
           (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      local_1128._8_8_ = 0;
      local_1118[0]._M_h._M_buckets = (__buckets_ptr)0x0;
      sStack_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1248._8_8_ != 0) {
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_1248._0_8_ + local_1248._8_8_ * 0x20);
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1248._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar15->_M_dataplus)._M_p,
                     pbVar15->_M_string_length);
          if (pbVar15 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1248._0_8_ + local_1248._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != pbVar12);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12a8,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      this = local_1300;
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                (local_1300,(char (*) [8])"layout(",&local_12a8,(char (*) [2])0x36641e,&local_12c8,
                 (char (*) [9])0x35e96b,&local_12f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
        operator_delete(local_12a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_12c8._M_dataplus._M_p);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_1288.higher._M_h);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1248);
    }
    else if (local_1304 == 0) {
      statement<char_const(&)[33],std::__cxx11::string&>
                (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_12f8);
    }
    else {
      statement<char_const(&)[51],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                (this,(char (*) [51])"layout(buffer_reference, buffer_reference_align = ",
                 &local_1304,(char (*) [10])0x35e96a,&local_12f8);
    }
    statement<char_const(&)[2]>(this,(char (*) [2])0x36b865);
    this->indent = this->indent + 1;
    if (*(int *)&(pSVar6->super_IVariant).field_0xc == 0xf) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(pSVar6->member_name_cache)._M_h);
      sVar5 = (pSVar6->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar5 != 0) {
        local_12d8 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)(pSVar6->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        lVar16 = sVar5 << 2;
        uVar18 = 0;
        do {
          add_member_name(local_1300,pSVar6,(uint32_t)uVar18);
          uVar3 = *(uint *)(local_12d8 + uVar18 * 4);
          local_1128._0_8_ = local_1128 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"","");
          (*(local_1300->super_Compiler)._vptr_Compiler[0x15])
                    (local_1300,pSVar6,(ulong)uVar3,uVar18 & 0xffffffff,(string *)local_1128,0);
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
            operator_delete((void *)local_1128._0_8_);
          }
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + -4;
        } while (lVar16 != 0);
      }
    }
    else {
      pSVar6 = Compiler::get_pointee_type(&this->super_Compiler,pSVar6);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar6,0);
      (*(this->super_Compiler)._vptr_Compiler[0x26])(local_1248,this,pSVar6);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128,(char (*) [7])" value",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248,
                 (char (*) [2])0x365574);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1238) {
        operator_delete((void *)local_1248._0_8_);
      }
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    this_00 = local_1300;
    end_scope_decl(local_1300);
    statement<char_const(&)[1]>(this_00,(char (*) [1])0x35b140);
  }
  else {
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_12f8,
               (char (*) [2])0x365574);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
    operator_delete(local_12f8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration)
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else if (type.basetype != SPIRType::Struct)
		buffer_name = type_to_glsl(type);
	else
		buffer_name = to_name(type.self, false);

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (type.basetype == SPIRType::Struct)
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else if (alignment)
			statement("layout(buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
		else
			statement("layout(buffer_reference) buffer ", buffer_name);

		begin_scope();

		if (type.basetype == SPIRType::Struct)
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}